

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_rbtree.c
# Opt level: O3

RBTNode * rbt_left_right_iterator(RBTreeIterator *iter)

{
  RBTNode *pRVar1;
  RBTNode *pRVar2;
  RBTNode *pRVar3;
  bool bVar4;
  
  pRVar3 = iter->last_visited;
  if (pRVar3 == (RBTNode *)0x0) {
    pRVar3 = iter->rbt->root;
    do {
      pRVar2 = pRVar3;
      pRVar3 = pRVar2->left;
    } while (pRVar2->left != &g_sentinel);
  }
  else {
    pRVar1 = pRVar3->right;
    if (pRVar3->right == &g_sentinel) {
      do {
        pRVar2 = pRVar3->parent;
        if (pRVar2 == (RBTNode *)0x0) {
          iter->last_visited = (RBTNode *)0x0;
          iter->is_over = true;
          return (RBTNode *)0x0;
        }
        bVar4 = pRVar2->left != pRVar3;
        pRVar3 = pRVar2;
      } while (bVar4);
    }
    else {
      do {
        pRVar2 = pRVar1;
        pRVar1 = pRVar2->left;
      } while (pRVar2->left != &g_sentinel);
    }
  }
  iter->last_visited = pRVar2;
  return pRVar2;
}

Assistant:

static RBTNode *
rbt_left_right_iterator(RBTreeIterator *iter)
{
    if (iter->last_visited == NULL)
    {
        iter->last_visited = iter->rbt->root;
        while (iter->last_visited->left != RBTNIL)
            iter->last_visited = iter->last_visited->left;

        return iter->last_visited;
    }

    if (iter->last_visited->right != RBTNIL)
    {
        iter->last_visited = iter->last_visited->right;
        while (iter->last_visited->left != RBTNIL)
            iter->last_visited = iter->last_visited->left;

        return iter->last_visited;
    }

    for (;;)
    {
        RBTNode    *came_from = iter->last_visited;

        iter->last_visited = iter->last_visited->parent;
        if (iter->last_visited == NULL)
        {
            iter->is_over = true;
            break;
        }

        if (iter->last_visited->left == came_from)
            break;              /* came from left sub-tree, return current
                                 * node */

        /* else - came from right sub-tree, continue to move up */
    }

    return iter->last_visited;
}